

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O1

CService * __thiscall HTTPRequest::GetPeer(CService *__return_storage_ptr__,HTTPRequest *this)

{
  DNSLookupFn dns_lookup_function;
  uint16_t portDefault;
  long lVar1;
  bool *pbVar2;
  long in_FS_OFFSET;
  uint16_t port;
  char *address;
  _Function_base in_stack_ffffffffffffff38;
  pointer in_stack_ffffffffffffff50;
  allocator<char> local_9b;
  uint16_t local_9a;
  char *local_98;
  string local_90;
  direct_or_indirect local_70;
  uint local_60;
  direct_or_indirect local_48;
  size_type local_38;
  undefined8 local_30;
  uint16_t local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = evhttp_request_get_connection(this->req);
  CService::CService(__return_storage_ptr__);
  if (lVar1 != 0) {
    local_98 = "";
    local_9a = 0;
    evhttp_connection_get_peer(lVar1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,local_98,&local_9b);
    portDefault = local_9a;
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&stack0xffffffffffffff40,&g_dns_lookup_abi_cxx11_);
    pbVar2 = (bool *)&stack0xffffffffffffff40;
    dns_lookup_function._M_invoker = (_Invoker_type)in_stack_ffffffffffffff50;
    dns_lookup_function.super__Function_base = in_stack_ffffffffffffff38;
    LookupNumeric((CService *)&local_70.indirect_contents,&local_90,portDefault,dns_lookup_function)
    ;
    MaybeFlipIPv6toCJDNS
              ((CService *)&local_48.indirect_contents,(CService *)&local_70.indirect_contents);
    if (0x10 < (__return_storage_ptr__->super_CNetAddr).m_addr._size) {
      free((__return_storage_ptr__->super_CNetAddr).m_addr._union.indirect_contents.indirect);
    }
    (__return_storage_ptr__->super_CNetAddr).m_addr._union.indirect_contents.indirect =
         local_48.indirect_contents.indirect;
    *(undefined8 *)((long)&(__return_storage_ptr__->super_CNetAddr).m_addr._union + 8) =
         local_48._8_8_;
    (__return_storage_ptr__->super_CNetAddr).m_addr._size = local_38;
    local_38 = 0;
    (__return_storage_ptr__->super_CNetAddr).m_net = (undefined4)local_30;
    (__return_storage_ptr__->super_CNetAddr).m_scope_id = local_30._4_4_;
    __return_storage_ptr__->port = local_28;
    if (0x10 < local_60) {
      free(local_70.indirect_contents.indirect);
      local_70.indirect_contents.indirect = (char *)0x0;
    }
    if (in_stack_ffffffffffffff50 != (pointer)0x0) {
      (*(code *)in_stack_ffffffffffffff50)
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)&stack0xffffffffffffff40,
                 (_Any_data *)&stack0xffffffffffffff40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3,pbVar2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CService HTTPRequest::GetPeer() const
{
    evhttp_connection* con = evhttp_request_get_connection(req);
    CService peer;
    if (con) {
        // evhttp retains ownership over returned address string
        const char* address = "";
        uint16_t port = 0;

#ifdef HAVE_EVHTTP_CONNECTION_GET_PEER_CONST_CHAR
        evhttp_connection_get_peer(con, &address, &port);
#else
        evhttp_connection_get_peer(con, (char**)&address, &port);
#endif // HAVE_EVHTTP_CONNECTION_GET_PEER_CONST_CHAR

        peer = MaybeFlipIPv6toCJDNS(LookupNumeric(address, port));
    }
    return peer;
}